

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O2

DdNode * Abc_NtkMultiDeriveBdd_rec(DdManager *dd,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *n;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x107,"DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)")
    ;
  }
  if ((*(uint *)&pNode->field_0x14 & 0x40) == 0) {
    *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 | 0x40;
    Vec_PtrPush(vFanins,pNode);
    pDVar1 = Abc_NtkMultiDeriveBdd_rec
                       (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vFanins
                       );
    Cudd_Ref(pDVar1);
    pDVar2 = Abc_NtkMultiDeriveBdd_rec
                       (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],
                        vFanins);
    Cudd_Ref(pDVar2);
    pDVar1 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^ (ulong)pDVar1);
    pDVar2 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^ (ulong)pDVar2);
    n = Cudd_bddAnd(dd,pDVar1,pDVar2);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar1);
    Cudd_RecursiveDeref(dd,pDVar2);
    (pNode->field_5).pData = n;
    if (n == (DdNode *)0x0) {
      __assert_fail("pNode->pData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x11c,
                    "DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  else {
    n = (DdNode *)(pNode->field_5).pData;
    if (n == (DdNode *)0x0) {
      __assert_fail("pNode->pData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x10b,
                    "DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  return n;
}

Assistant:

DdNode * Abc_NtkMultiDeriveBdd_rec( DdManager * dd, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    assert( !Abc_ObjIsComplement(pNode) );
    // if the result is available return
    if ( pNode->fMarkC )
    {
        assert( pNode->pData ); // network has a cycle
        return (DdNode *)pNode->pData;
    }
    // mark the node as visited
    pNode->fMarkC = 1;
    Vec_PtrPush( vFanins, pNode );
    // compute the result for both branches
    bFunc0 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,0), vFanins ); Cudd_Ref( bFunc0 );
    bFunc1 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,1), vFanins ); Cudd_Ref( bFunc1 );
    bFunc0 = Cudd_NotCond( bFunc0, (long)Abc_ObjFaninC0(pNode) );
    bFunc1 = Cudd_NotCond( bFunc1, (long)Abc_ObjFaninC1(pNode) );
    // get the final result
    bFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_RecursiveDeref( dd, bFunc1 );
    // set the result
    pNode->pData = bFunc;
    assert( pNode->pData );
    return bFunc;
}